

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

bool __thiscall
SGParser::Generator::Lex::MakeNFA
          (Lex *this,NFA *nfa,String *regExp,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
          *macroNFAs)

{
  bool bVar1;
  RegExprNFAParseElement *pRVar2;
  ParseHandler<SGParser::Generator::RegExprNFAParseElement> local_2f8;
  RegExprNFAParseHandler parseHandler;
  Parse<SGParser::Generator::RegExprNFAParseElement> parse;
  InputStream local_178;
  MemBufferInputStream inputStream;
  RegExpTokenizer<SGParser::Generator::RegExprParseToken> tokenizer;
  ParseMessage msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  String local_78;
  Lex *local_58;
  String local_50;
  
  if ((this->NFAParseTable).super_ParseTable.Type == None) {
    parse.Stream.super_TokenStream<SGParser::Generator::RegExprParseToken>._vptr_TokenStream =
         (_func_int **)&parse;
    parse.pParseTable._0_4_ = 0;
    parse.pTokenizer = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
    parse.Stream.pFirstBlock = (StreamBlock *)0x0;
    parse.Stream.LengthLeft = (size_t)&parse.Stream.ThisPos;
    parse.Stream.ThisPos._0_4_ = 0;
    parse.Stream.RememberLength = 0;
    parse.StackPosition =
         (long)&parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header + 0x18;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parse.Stream.SourceEOFFlag = false;
    parse.Stream._65_7_ = 0;
    parse.Stream.Markers._M_t._M_impl._0_8_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    parse.pValidTokenStackPositions = (size_t *)&parse.Token;
    parse.Token.super_TokenCode.Code = 0;
    parse.ReduceLeft = 0;
    parse._188_4_ = 0;
    parse.pStack = (RegExprNFAParseElement *)0x0;
    parse.TopState = 0;
    parse.NextTokenFlag = false;
    parse._165_3_ = 0;
    parse.ErrorStackStr.field_2._8_4_ = 0;
    parse.ErrorStackStr._M_string_length = 0;
    parse.ErrorStackStr.field_2._M_allocated_capacity = 0;
    parse.LastErrorState = 0;
    parse._212_4_ = 0;
    parse.ErrorStackStr._M_dataplus._M_p = (pointer)0x0;
    parse.Stream.pSourceStream =
         (TokenStream<SGParser::Generator::RegExprParseToken> *)
         parse.Stream.super_TokenStream<SGParser::Generator::RegExprParseToken>._vptr_TokenStream;
    parse.Stream.Pos = parse.Stream.LengthLeft;
    parse.StackSize = parse.StackPosition;
    parse.ErrorMarker = (size_t)parse.pValidTokenStackPositions;
    local_58 = (Lex *)macroNFAs;
    CreateRegExpGrammar(this,(Grammar *)&parseHandler.pMacroNFAs);
    bVar1 = ParseTableGen::Create(&this->NFAParseTable,(Grammar *)&parseHandler.pMacroNFAs,CLR);
    Grammar::~Grammar((Grammar *)&parseHandler.pMacroNFAs);
    macroNFAs = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                 *)local_58;
    if (!bVar1) {
      return false;
    }
  }
  inputStream.super_InputStream._vptr_InputStream = (_func_int **)(regExp->_M_dataplus)._M_p;
  inputStream.buf = (uint8_t *)regExp->_M_string_length;
  local_178._vptr_InputStream = (_func_int **)&PTR__MemBufferInputStream_001622d8;
  inputStream.size = 0;
  TokenizerImpl<SGParser::Generator::RegExprParseToken>::TokenizerImpl
            ((TokenizerImpl<SGParser::Generator::RegExprParseToken> *)&inputStream.pos,&local_178);
  inputStream.pos = (size_t)&PTR__TokenizerImpl_00164c80;
  Parse<SGParser::Generator::RegExprNFAParseElement>::Parse
            ((Parse<SGParser::Generator::RegExprNFAParseElement> *)&parseHandler.pMacroNFAs,
             &(this->NFAParseTable).super_ParseTable,
             (TokenStream<SGParser::Generator::RegExprParseToken> *)&inputStream.pos,0x800);
  local_2f8._vptr_ParseHandler = (_func_int **)&PTR__ParseHandler_00164c30;
  parseHandler.super_ParseHandler<SGParser::Generator::RegExprNFAParseElement>._vptr_ParseHandler.
  _0_4_ = nfa->LexemeId;
  parseHandler._8_8_ = this;
  parseHandler.pLex = (Lex *)macroNFAs;
  bVar1 = Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse
                    ((Parse<SGParser::Generator::RegExprNFAParseElement> *)&parseHandler.pMacroNFAs,
                     &local_2f8);
  if (bVar1) {
    pRVar2 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprNFAParseElement> *)
                        &parseHandler.pMacroNFAs,0);
    NFA::MoveData(nfa,(pRVar2->field_1).pNFA);
    pRVar2 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprNFAParseElement> *)
                        &parseHandler.pMacroNFAs,0);
    RegExprNFAParseElement::Destroy(pRVar2);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"NFA: Regular expression parsing error","");
    local_88._M_local_buf[0] = '\0';
    msg.FileName.field_2._8_8_ = &local_88;
    ParseMessage::ParseMessage
              ((ParseMessage *)
               &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38,
               ErrorMessage,&local_50,&local_78,0,0xffffffffffffffff,0xffffffffffffffff,
               (String *)((long)&msg.FileName.field_2 + 8),0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg.FileName.field_2._8_8_ != &local_88) {
      operator_delete((void *)msg.FileName.field_2._8_8_,
                      CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ParseMessageBuffer::AddMessage
              (&this->Messages,
               (ParseMessage *)
               &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38);
    if ((size_type *)msg.Offset != &msg.FileName._M_string_length) {
      operator_delete((void *)msg.Offset,msg.FileName._M_string_length + 1);
    }
    if ((size_type *)msg.Name.field_2._8_8_ != &msg.Message._M_string_length) {
      operator_delete((void *)msg.Name.field_2._8_8_,msg.Message._M_string_length + 1);
    }
    if ((size_type *)msg._0_8_ != &msg.Name._M_string_length) {
      operator_delete((void *)msg._0_8_,msg.Name._M_string_length + 1);
    }
  }
  Parse<SGParser::Generator::RegExprNFAParseElement>::~Parse
            ((Parse<SGParser::Generator::RegExprNFAParseElement> *)&parseHandler.pMacroNFAs);
  TokenizerBase::FreeAllBuffers((TokenizerBase *)&tokenizer);
  return bVar1;
}

Assistant:

bool Lex::MakeNFA(NFA& nfa, const String& regExp, std::map<String, NFA*>& macroNFAs) {
    if (!NFAParseTable.IsValid()) {
        // Create the hard coded Regular Expression grammar
        Grammar grammar;
        CreateRegExpGrammar(grammar);

        // And make parse table out of it
        if (!NFAParseTable.Create(grammar))
            return false;  // Should probably throw exception
    }

    // Make an input stream with the regular expression string we've got
    MemBufferInputStream inputStream{regExp};

    // Create a tokenizer to get input. Since we're giving it a nullptr lexeme list,
    // it will just return each character exactly as it appears in the input string
    RegExpTokenizer<RegExprParseToken> tokenizer{&inputStream};

    // Initialize Parsing
    Parse<RegExprNFAParseElement> parse{&NFAParseTable, &tokenizer};
    RegExprNFAParseHandler        parseHandler;

    // Set the custom parse handler custom data
    parseHandler.LexemeID   = nfa.GetLexemeID();
    parseHandler.pLex       = this;
    parseHandler.pMacroNFAs = &macroNFAs;

    // Let the parse class parse the regular expression using
    // using the custom parseHandler reduce callback
    if (!parse.DoParse(parseHandler)) {
        const ParseMessage msg{ParseMessage::ErrorMessage, "",
                               "NFA: Regular expression parsing error"};
        Messages.AddMessage(msg);
        return false;
    }

    // Move result NFA data over to us, and destroy result NFA
    nfa.MoveData(*parse[0].pNFA);
    parse[0].Destroy();

    return true;
}